

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O1

Matrix<Rational> __thiscall Matrix<Rational>::operator*(Matrix<Rational> *this,Matrix<Rational> *a)

{
  matrix_error *this_00;
  uint uVar1;
  uint *in_RDX;
  Matrix<Rational> MVar3;
  Rational *pRVar2;
  
  if (a->N == *in_RDX) {
    uVar1 = in_RDX[1];
    if (in_RDX[1] < a->M) {
      uVar1 = a->M;
    }
    if (uVar1 < 0x20) {
      MVar3 = _multiplyCube(this,a);
      pRVar2 = MVar3.arr;
    }
    else {
      MVar3 = _multiplyStrassen(this,a);
      pRVar2 = MVar3.arr;
    }
    MVar3.arr = pRVar2;
    MVar3._0_8_ = this;
    return MVar3;
  }
  this_00 = (matrix_error *)__cxa_allocate_exception(0x10);
  matrix_error::runtime_error(this_00,"Trying to multiply matrices of different size");
  __cxa_throw(this_00,&matrix_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

const Matrix<Field> Matrix<Field>::operator*(const Matrix &a) const
{
    if(N != a.M)
        throw matrix_error("Trying to multiply matrices of different size");
    if(std::max(M, a.N) < strassen_threshold)
    {
        return _multiplyCube(a);
    }
    else
    {
        return _multiplyStrassen(a);
    }
}